

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ListColumnData::Skip(ListColumnData *this,ColumnScanState *state,idx_t count)

{
  reference pvVar1;
  idx_t count_00;
  pointer pCVar2;
  ColumnData *this_00;
  ulong uVar3;
  long lVar4;
  UnifiedVectorFormat offsets;
  Vector offset_vector;
  undefined1 local_f0 [32];
  DataTableInfo *local_d0;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined1 local_90 [96];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  pvVar1 = vector<duckdb::ColumnScanState,_true>::operator[](&state->child_states,0);
  ColumnScanState::Next(pvVar1,count);
  LogicalType::LogicalType((LogicalType *)local_f0,UBIGINT);
  Vector::Vector((Vector *)local_90,(LogicalType *)local_f0,count);
  this_00 = (ColumnData *)local_f0;
  LogicalType::~LogicalType((LogicalType *)this_00);
  count_00 = ColumnData::ScanVector(this_00,state,(Vector *)local_90,count,SCAN_FLAT_VECTOR,0);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)(local_f0 + 0x18));
  Vector::ToUnifiedFormat((Vector *)local_90,count_00,(UnifiedVectorFormat *)(local_f0 + 0x18));
  if (*(_func_int ***)local_f0._24_8_ == (_func_int **)0x0) {
    uVar3 = count_00 - 1;
  }
  else {
    uVar3 = (ulong)*(uint *)((long)*(_func_int ***)local_f0._24_8_ + count_00 * 4 + -4);
  }
  lVar4 = (long)(&local_d0->db)[uVar3] - state->last_offset;
  if (lVar4 != 0) {
    state->last_offset = (idx_t)(&local_d0->db)[uVar3];
    pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(&this->child_column);
    pvVar1 = vector<duckdb::ColumnScanState,_true>::operator[](&state->child_states,1);
    (*pCVar2->_vptr_ColumnData[0x10])(pCVar2,pvVar1,lVar4);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_b8 != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._80_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._80_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._56_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._56_8_);
  }
  LogicalType::~LogicalType((LogicalType *)(local_90 + 8));
  return;
}

Assistant:

void ListColumnData::Skip(ColumnScanState &state, idx_t count) {
	// skip inside the validity segment
	validity.Skip(state.child_states[0], count);

	// we need to read the list entries/offsets to figure out how much to skip
	// note that we only need to read the first and last entry
	// however, let's just read all "count" entries for now
	Vector offset_vector(LogicalType::UBIGINT, count);
	idx_t scan_count = ScanVector(state, offset_vector, count, ScanVectorType::SCAN_FLAT_VECTOR);
	D_ASSERT(scan_count > 0);

	UnifiedVectorFormat offsets;
	offset_vector.ToUnifiedFormat(scan_count, offsets);
	auto data = UnifiedVectorFormat::GetData<uint64_t>(offsets);
	auto last_entry = data[offsets.sel->get_index(scan_count - 1)];
	idx_t child_scan_count = last_entry - state.last_offset;
	if (child_scan_count == 0) {
		return;
	}
	state.last_offset = last_entry;

	// skip the child state forward by the child_scan_count
	child_column->Skip(state.child_states[1], child_scan_count);
}